

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ellispes_approach.cpp
# Opt level: O0

pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect> *
ellipses::detect_circle_approach
          (pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>
           *__return_storage_ptr__,Mat *pretreat,Mat *original,bool agregate_contour,bool debug)

{
  float *this;
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  double dVar4;
  __type _Var5;
  _InputArray local_1f8;
  undefined1 local_1e0 [28];
  RotatedRect rect;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> local_1a0;
  Point_<int> *local_188;
  Point_<int> *local_180;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_178;
  __normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
  local_170;
  const_iterator local_168;
  Point local_center;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *r;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *__range2;
  double meand;
  Point top_center;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *v;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  *__range1;
  vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> result;
  _OutputArray local_e8;
  _InputArray local_d0;
  undefined1 local_b8 [8];
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  contours;
  allocator<char> local_81;
  string local_80 [55];
  allocator<char> local_49;
  string local_48 [38];
  byte local_22;
  byte local_21;
  bool debug_local;
  Mat *pMStack_20;
  bool agregate_contour_local;
  Mat *original_local;
  Mat *pretreat_local;
  
  local_22 = debug;
  local_21 = agregate_contour;
  pMStack_20 = original;
  original_local = pretreat;
  pretreat_local = (Mat *)__return_storage_ptr__;
  if (debug) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_48,"gray",&local_49);
    cv::namedWindow(local_48,0);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator(&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_80,"gray",&local_81);
    cv::_InputArray::_InputArray
              ((_InputArray *)
               &contours.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,original_local);
    cv::imshow(local_80,(_InputArray *)
                        &contours.
                         super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cv::_InputArray::~_InputArray
              ((_InputArray *)
               &contours.
                super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator(&local_81);
    cv::waitKey(0);
  }
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
            *)local_b8);
  cv::_InputArray::_InputArray(&local_d0,original_local);
  cv::_OutputArray::_OutputArray<cv::Point_<int>>
            (&local_e8,
             (vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
              *)local_b8);
  cv::Point_<int>::Point_
            ((Point_<int> *)
             &result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cv::findContours(&local_d0,&local_e8,1,2,
                   &result.super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  cv::_OutputArray::~_OutputArray(&local_e8);
  cv::_InputArray::~_InputArray(&local_d0);
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
  __end1 = std::
           vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
           ::begin((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                    *)local_b8);
  v = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
      std::
      vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
      ::end((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_b8);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                                     *)&v), bVar1) {
    top_center = (Point)__gnu_cxx::
                        __normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                        ::operator*(&__end1);
    sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)top_center);
    sVar2 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                      ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
    if (sVar2 < sVar3) {
      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=
                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1,
                 (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)top_center);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
    ::operator++(&__end1);
  }
  if ((local_21 & 1) != 0) {
    center_of_mass<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&meand);
    dVar4 = mean_distance((Point *)&meand,
                          (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
    __end2 = std::
             vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             ::begin((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                      *)local_b8);
    r = (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
        std::
        vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
        ::end((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
               *)local_b8);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                                       *)&r), bVar1) {
      local_center = (Point)__gnu_cxx::
                            __normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
                            ::operator*(&__end2);
      sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                        ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_center)
      ;
      if (6 < sVar3) {
        center_of_mass<std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                  ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                   &stack0xfffffffffffffea0);
        bVar1 = cv::operator!=((Point_<int> *)&meand,(Point_<int> *)&stack0xfffffffffffffea0);
        if ((bVar1) &&
           (_Var5 = euclideanDistance<cv::Point_<int>>
                              ((Point_<int> *)&meand,(Point_<int> *)&stack0xfffffffffffffea0),
           _Var5 < dVar4 * 2.5)) {
          local_170._M_current =
               (Point_<int> *)
               std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end
                         ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
          __gnu_cxx::
          __normal_iterator<cv::Point_<int>const*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
          ::__normal_iterator<cv::Point_<int>*>
                    ((__normal_iterator<cv::Point_<int>const*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>
                      *)&local_168,&local_170);
          local_178._M_current =
               (Point_<int> *)
               std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::begin
                         ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)local_center
                         );
          local_180 = (Point_<int> *)
                      std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::end
                                ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)
                                 local_center);
          local_188 = (Point_<int> *)
                      std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
                      insert<__gnu_cxx::__normal_iterator<cv::Point_<int>*,std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>>,void>
                                ((vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)
                                 &__range1,local_168,local_178,
                                 (__normal_iterator<cv::Point_<int>_*,_std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>
                                  )local_180);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_*,_std::vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>_>
      ::operator++(&__end2);
    }
    this = &rect.size.height;
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::vector
              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this,
               (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
    cleanup_center_points
              (&local_1a0,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)this,
               pMStack_20,(bool)(local_22 & 1));
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::operator=
              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1,&local_1a0);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector(&local_1a0);
    std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
              ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&rect.size.height);
  }
  cv::RotatedRect::RotatedRect((RotatedRect *)(local_1e0 + 0x14));
  sVar3 = std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::size
                    ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
  if (5 < sVar3) {
    cv::_InputArray::_InputArray<cv::Point_<int>>
              (&local_1f8,(vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
    cv::fitEllipse((_InputArray *)local_1e0);
    cv::RotatedRect::operator=((RotatedRect *)(local_1e0 + 0x14),(RotatedRect *)local_1e0);
    cv::_InputArray::~_InputArray(&local_1f8);
  }
  std::pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_cv::RotatedRect>::
  pair<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_&,_cv::RotatedRect_&,_true>
            (__return_storage_ptr__,
             (vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1,
             (RotatedRect *)(local_1e0 + 0x14));
  std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>::~vector
            ((vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *)&__range1);
  std::
  vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
  ::~vector((vector<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
             *)local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<cv::Point>, cv::RotatedRect> detect_circle_approach(
    const cv::Mat& pretreat, const cv::Mat& original, bool agregate_contour, bool debug)
{
    if(debug)
    {
        cv::namedWindow("gray", cv::WINDOW_NORMAL);
        cv::imshow("gray", pretreat);
        cv::waitKey(0);
    }

    std::vector<std::vector<cv::Point>> contours;
    findContours(pretreat, contours, cv::RETR_LIST, cv::CHAIN_APPROX_SIMPLE);

    std::vector<cv::Point> result;

    for(auto& v : contours)
    {
        if(v.size() > result.size())
        {
            result = v;
        }
    }

    if(agregate_contour)
    {
        auto top_center = center_of_mass(result);
        auto meand = mean_distance(top_center, result) * 2.5;

        for(auto& r : contours)
        {
            if(r.size() > 6)
            {
                auto local_center = center_of_mass(r);

                if(top_center != local_center && euclideanDistance(top_center, local_center) < meand)
                {
                    result.insert(result.end(), r.begin(), r.end());
                }
            }
        }

        result = cleanup_center_points(std::move(result), original, debug);
    }

    cv::RotatedRect rect;
    if(result.size() > 5)
        rect = cv::fitEllipse(result);

    return {result, rect};
}